

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O1

bool __thiscall BanMan::IsBanned(BanMan *this,CNetAddr *net_addr)

{
  bool bVar1;
  int64_t iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  bool bVar5;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  CSubNet sub_net;
  unique_lock<std::mutex> local_80;
  direct_or_indirect local_70;
  uint local_60;
  _Base_ptr local_58;
  undefined8 local_50;
  _Base_ptr p_Stack_48;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = GetTime();
  local_80._M_owns = false;
  local_80._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_80);
  p_Var3 = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_banned)._M_t._M_impl.super__Rb_tree_header;
  bVar5 = (_Rb_tree_header *)p_Var3 != p_Var4;
  if (bVar5) {
    do {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(p_Var3 + 1));
      local_58 = p_Var3[1]._M_right;
      local_40 = *(undefined1 *)&p_Var3[2]._M_left;
      local_50 = *(undefined8 *)(p_Var3 + 2);
      p_Stack_48 = p_Var3[2]._M_parent;
      if ((iVar2 < (long)p_Var3[3]._M_parent) &&
         (bVar1 = CSubNet::Match((CSubNet *)&local_70.indirect_contents,net_addr), bVar1)) {
        if (0x10 < local_60) {
          free(local_70.indirect_contents.indirect);
          local_70.indirect_contents.indirect = (char *)0x0;
        }
        break;
      }
      if (0x10 < local_60) {
        free(local_70.indirect_contents.indirect);
        local_70.indirect_contents.indirect = (char *)0x0;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar5 = (_Rb_tree_header *)p_Var3 != p_Var4;
    } while (bVar5);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool BanMan::IsBanned(const CNetAddr& net_addr)
{
    auto current_time = GetTime();
    LOCK(m_banned_mutex);
    for (const auto& it : m_banned) {
        CSubNet sub_net = it.first;
        CBanEntry ban_entry = it.second;

        if (current_time < ban_entry.nBanUntil && sub_net.Match(net_addr)) {
            return true;
        }
    }
    return false;
}